

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageTemplate.cpp
# Opt level: O0

MessageTemplate * __thiscall
ki::protocol::dml::MessageTemplate::get_name_abi_cxx11_(MessageTemplate *this)

{
  string *in_RSI;
  MessageTemplate *this_local;
  
  std::__cxx11::string::string((string *)this,in_RSI);
  return this;
}

Assistant:

std::string MessageTemplate::get_name() const
	{
		return m_name;
	}